

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

Path * find_path(Path *__return_storage_ptr__,Grid *grid)

{
  NodeList *this;
  GridNode *pGVar1;
  int iVar2;
  NODE_STATE NVar3;
  GridNode *pGVar4;
  GridNode *pGVar5;
  GridNode **ppGVar6;
  long *plVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  Heap openList;
  Heap closedList;
  Heap local_60;
  GridNode *local_50;
  Heap local_48;
  Path *local_38;
  
  local_38 = __return_storage_ptr__;
  pGVar4 = Grid::get_start_node(grid);
  pGVar5 = Grid::get_target_node(grid);
  local_60.maxCount = 0xe1;
  ppGVar6 = (GridNode **)operator_new__(0x708);
  iVar11 = 0;
  local_60.count = 0;
  local_48.maxCount = 0xe1;
  local_60.list = ppGVar6;
  local_48.list = (GridNode **)operator_new__(0x708);
  local_48.count = 0;
  pGVar4->index = 0;
  *ppGVar6 = pGVar4;
  local_50 = pGVar4;
  Heap::sort_up(&local_60,pGVar4);
  local_60.count = local_60.count + 1;
  do {
    if (local_60.count < 1) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    pGVar4 = *local_60.list;
    lVar10 = (long)local_60.count;
    local_60.count = local_60.count + -1;
    *local_60.list = local_60.list[lVar10 + -1];
    pGVar1 = *local_60.list;
    pGVar1->index = 0;
    Heap::sort_down(&local_60,pGVar1);
    pGVar4->index = local_48.count;
    local_48.list[local_48.count] = pGVar4;
    Heap::sort_up(&local_48,pGVar4);
    local_48.count = local_48.count + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Current Node:",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(pGVar4->pos).x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pGVar4->pos).y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (pGVar4 == pGVar5) break;
    if (0 < pGVar4->neighbourCount) {
      lVar10 = 0;
      do {
        pGVar1 = (pGVar4->neighbours).super__Vector_base<GridNode_*,_std::allocator<GridNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar10];
        NVar3 = pGVar1->state;
        if ((NVar3 != BLOCKED) && ((local_48.count < 1 || (local_48.list[pGVar1->index] != pGVar1)))
           ) {
          iVar13 = (pGVar1->pos).x;
          iVar14 = (pGVar1->pos).y;
          iVar9 = (pGVar4->pos).x - iVar13;
          iVar2 = -iVar9;
          if (0 < iVar9) {
            iVar2 = iVar9;
          }
          iVar12 = (pGVar4->pos).y - iVar14;
          iVar9 = -iVar12;
          if (0 < iVar12) {
            iVar9 = iVar12;
          }
          iVar12 = iVar9;
          if (iVar2 < iVar9) {
            iVar12 = iVar2;
          }
          lVar16 = (long)iVar2 - (long)iVar9;
          lVar15 = -lVar16;
          if (0 < lVar16) {
            lVar15 = lVar16;
          }
          iVar2 = iVar12 * 0xe + pGVar4->gCost + (int)lVar15 * 10;
          if ((((long)local_60.count < 1) || (local_60.list[pGVar1->index] != pGVar1)) ||
             (iVar2 < pGVar1->gCost)) {
            pGVar1->gCost = iVar2;
            iVar13 = (pGVar5->pos).x - iVar13;
            iVar2 = -iVar13;
            if (0 < iVar13) {
              iVar2 = iVar13;
            }
            iVar14 = (pGVar5->pos).y - iVar14;
            iVar13 = -iVar14;
            if (0 < iVar14) {
              iVar13 = iVar14;
            }
            iVar14 = iVar13;
            if (iVar2 < iVar13) {
              iVar14 = iVar2;
            }
            lVar16 = (long)iVar2 - (long)iVar13;
            lVar15 = -lVar16;
            if (0 < lVar16) {
              lVar15 = lVar16;
            }
            pGVar1->hCost = iVar14 * 0xe + (int)lVar15 * 10;
            pGVar1->parent = pGVar4;
            if ((local_60.count < 1) || (local_60.list[pGVar1->index] != pGVar1)) {
              if (pGVar1 != pGVar5) {
                NVar3 = NEIGHBOUR;
              }
              pGVar1->state = NVar3;
              pGVar1->index = local_60.count;
              local_60.list[local_60.count] = pGVar1;
              Heap::sort_up(&local_60,pGVar1);
              local_60.count = local_60.count + 1;
            }
            else {
              Heap::sort_up(&local_60,pGVar1);
            }
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pGVar4->neighbourCount);
    }
    if (pGVar4 != local_50) {
      pGVar4->state = CHECKED;
    }
    iVar11 = iVar11 + 1;
  } while (pGVar4 != pGVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path Found!!!",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_38->number = 0;
  (local_38->grids).count = 0;
  (local_38->grids).capacity = 0;
  pGVar4 = pGVar5->parent;
  if (pGVar4 != local_50) {
    this = &local_38->grids;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path Node:",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(pGVar4->pos).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pGVar4->pos).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      NodeList::add_node(this,pGVar4);
      pGVar4 = pGVar4->parent;
      local_38->number = local_38->number + 1;
    } while (pGVar4 != local_50);
  }
  return local_38;
}

Assistant:

Path find_path(Grid *grid)
{
    // Setup nodes
    GridNode *startNode = grid->get_start_node();
    GridNode *targetNode = grid->get_target_node();

    // Calculate Path

#if USE_HEAPS
    Heap openList;
    Heap closedList;
    openList.add_to_heap(startNode);
#else
    NodeList openList;
    NodeList closedList;
    openList.add_node(startNode);
#endif
    int iteration = 0;
    while (openList.count > 0)
    {
        std::cout << "Iteration: " << iteration << std::endl;
        iteration++;
// Find Current Node
#if USE_HEAPS
        GridNode *currentNode = openList.remove_first();
        closedList.add_to_heap(currentNode);
#else
        GridNode *currentNode = openList.get_current_node();
        openList.remove_node(currentNode);
        closedList.add_node(currentNode);
#endif
        std::cout << "Current Node:"
                  << "(" << currentNode->pos.x << "," << currentNode->pos.y << ")" << std::endl;
        if (currentNode == targetNode)
        {
            break;
        }
        // Check Neighbours
        for (int i = 0; i < currentNode->neighbourCount; i++)
        {
            GridNode *neighbour = currentNode->neighbours[i];
            if (neighbour->is_traversable() && !closedList.has_node(neighbour))
            {
                int moveCost = currentNode->gCost + get_distance_bw_nodes(currentNode, neighbour);
                if (!openList.has_node(neighbour) || moveCost < neighbour->gCost)
                {
                    neighbour->gCost = moveCost;
                    neighbour->hCost = get_distance_bw_nodes(targetNode, neighbour);
                    neighbour->parent = currentNode;
                    if (!openList.has_node(neighbour))
                    {
                        neighbour->state = (neighbour != targetNode) ? NEIGHBOUR : neighbour->state;
#if USE_HEAPS
                        openList.add_to_heap(neighbour);
#else
                        openList.add_node(neighbour);
#endif
                    }
                    else
                    {
#if USE_HEAPS
                        openList.update_item(neighbour);
#else
                        set_cost(neighbour, startNode, targetNode);
#endif
                    }
                }
            }
        }
        if (currentNode != startNode)
        {
            currentNode->state = CHECKED;
        }
    }
    std::cout << "Path Found!!!" << std::endl;

    // Setup Path
    Path p;
    GridNode *node = targetNode->parent;
    while (node != startNode)
    {
        std::cout << "Path Node:"
                  << "(" << node->pos.x << "," << node->pos.y << ")" << std::endl;
        p.grids.add_node(node);
        node = node->parent;
        p.number++;
    }
    return p;
}